

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O2

void do_accept(uv_timer_t *timer_handle)

{
  uv_stream_t *server;
  int iVar1;
  uv_tcp_t *tcp;
  uv_loop_t *loop;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  undefined8 uStackY_50;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  tcp = (uv_tcp_t *)malloc(0xd8);
  if (timer_handle == (uv_timer_t *)0x0) {
    pcVar2 = "timer_handle";
    uStackY_50 = 0x35;
  }
  else {
    if (tcp != (uv_tcp_t *)0x0) {
      loop = uv_default_loop();
      iVar1 = uv_tcp_init(loop,tcp);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        server = (uv_stream_t *)timer_handle->data;
        iVar1 = uv_accept(server,(uv_stream_t *)tcp);
        eval_a = (int64_t)iVar1;
        if (eval_a == 0) {
          do_accept_called = do_accept_called + 1;
          uv_close((uv_handle_t *)tcp,close_cb);
          if (do_accept_called == 2) {
            uv_close((uv_handle_t *)server,close_cb);
          }
          uv_close((uv_handle_t *)timer_handle,close_cb);
          return;
        }
        uStackY_50 = 0x3d;
      }
      else {
        uStackY_50 = 0x39;
      }
      pcVar3 = "==";
      pcVar2 = "r";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
      pcVar5 = "==";
      pcVar4 = "0";
      goto LAB_00117664;
    }
    pcVar2 = "accepted_handle";
    uStackY_50 = 0x36;
  }
  pcVar5 = "!=";
  eval_a = 0;
  pcVar4 = "NULL";
  pcVar3 = "!=";
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
LAB_00117664:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-delayed-accept.c"
          ,uStackY_50,pcVar2,pcVar3,pcVar4,eval_a,pcVar5,0);
  abort();
}

Assistant:

static void do_accept(uv_timer_t* timer_handle) {
  uv_tcp_t* server;
  uv_tcp_t* accepted_handle = (uv_tcp_t*)malloc(sizeof *accepted_handle);
  int r;

  ASSERT_NOT_NULL(timer_handle);
  ASSERT_NOT_NULL(accepted_handle);

  r = uv_tcp_init(uv_default_loop(), accepted_handle);
  ASSERT_OK(r);

  server = (uv_tcp_t*)timer_handle->data;
  r = uv_accept((uv_stream_t*)server, (uv_stream_t*)accepted_handle);
  ASSERT_OK(r);

  do_accept_called++;

  /* Immediately close the accepted handle. */
  uv_close((uv_handle_t*)accepted_handle, close_cb);

  /* After accepting the two clients close the server handle */
  if (do_accept_called == 2) {
    uv_close((uv_handle_t*)server, close_cb);
  }

  /* Dispose the timer. */
  uv_close((uv_handle_t*)timer_handle, close_cb);
}